

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civil_time_detail.h
# Opt level: O3

weekday absl::time_internal::cctz::detail::get_weekday(civil_second *cs)

{
  ulong uVar1;
  long lVar2;
  long lVar3;
  ulong uVar4;
  
  lVar2 = (long)(cs->f_).m;
  lVar3 = (cs->f_).y % 400 - (ulong)(lVar2 < 3);
  uVar1 = lVar3 + 0x960;
  uVar4 = uVar1 & 0xffff;
  return *(weekday *)
          (&DAT_00173298 +
          ((long)(((lVar3 + (uVar1 >> 2) + 0x960 +
                   (long)(cs->f_).d + (long)*(int *)(&DAT_001732c0 + lVar2 * 4)) -
                  (ulong)((uint)(uVar4 >> 2) / 0x19)) + (ulong)((uint)uVar4 / 400)) % 7) * 4);
}

Assistant:

CONSTEXPR_M int month() const noexcept { return f_.m; }